

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AutoLoadExtensions(sqlite3 *db)

{
  bool bVar1;
  uint uVar2;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  sqlite3_api_routines *pThunk;
  sqlite3_mutex *mutex;
  sqlite3_loadext_entry xInit;
  int rc;
  int go;
  u32 i;
  char *zErrmsg;
  int in_stack_ffffffffffffffbc;
  _func_void *local_30;
  uint local_1c;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  if (sqlite3Autoext.nExt != 0) {
    local_1c = 0;
    while (bVar1) {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      sqlite3MutexAlloc(in_stack_ffffffffffffffbc);
      sqlite3_mutex_enter((sqlite3_mutex *)0x23c703);
      if (local_1c < sqlite3Autoext.nExt) {
        local_30 = sqlite3Autoext.aExt[local_1c];
      }
      else {
        local_30 = (_func_void *)0x0;
        bVar1 = false;
      }
      sqlite3_mutex_leave((sqlite3_mutex *)0x23c740);
      local_10 = (undefined1 *)0x0;
      if ((local_30 != (_func_void *)0x0) &&
         (uVar2 = (*local_30)(in_RDI,&local_10,&sqlite3Apis), uVar2 != 0)) {
        sqlite3ErrorWithMsg(in_RDI,(int)(ulong)uVar2,"automatic extension loading failed: %s",
                            local_10);
        bVar1 = false;
      }
      sqlite3_free((void *)0x23c79e);
      local_1c = local_1c + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AutoLoadExtensions(sqlite3 *db){
  u32 i;
  int go = 1;
  int rc;
  sqlite3_loadext_entry xInit;

  wsdAutoextInit;
  if( wsdAutoext.nExt==0 ){
    /* Common case: early out without every having to acquire a mutex */
    return;
  }
  for(i=0; go; i++){
    char *zErrmsg;
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
#ifdef SQLITE_OMIT_LOAD_EXTENSION
    const sqlite3_api_routines *pThunk = 0;
#else
    const sqlite3_api_routines *pThunk = &sqlite3Apis;
#endif
    sqlite3_mutex_enter(mutex);
    if( i>=wsdAutoext.nExt ){
      xInit = 0;
      go = 0;
    }else{
      xInit = (sqlite3_loadext_entry)wsdAutoext.aExt[i];
    }
    sqlite3_mutex_leave(mutex);
    zErrmsg = 0;
    if( xInit && (rc = xInit(db, &zErrmsg, pThunk))!=0 ){
      sqlite3ErrorWithMsg(db, rc,
            "automatic extension loading failed: %s", zErrmsg);
      go = 0;
    }
    sqlite3_free(zErrmsg);
  }
}